

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O1

int hexdigit_to_int(char ch)

{
  int iVar1;
  
  iVar1 = -1;
  if ((byte)(ch - 0x30U) < 0x37) {
    iVar1 = *(int *)(&DAT_00138058 + (ulong)(byte)(ch - 0x30U) * 4);
  }
  return iVar1;
}

Assistant:

int hexdigit_to_int(char ch)
{
	switch (ch)
	{
		case '0':
			return 0;
		case '1':
			return 1;
		case '2':
			return 2;
		case '3':
			return 3;
		case '4':
			return 4;
		case '5':
			return 5;
		case '6':
			return 6;
		case '7':
			return 7;
		case '8':
			return 8;
		case '9':
			return 9;
		case 'a':
		case 'A':
			return 10;
		case 'b':
		case 'B':
			return 11;
		case 'c':
		case 'C':
			return 12;
		case 'd':
		case 'D':
			return 13;
		case 'e':
		case 'E':
			return 14;
		case 'f':
		case 'F':
			return 15;
		default:
			return -1;
	}
}